

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excitation_generation.cc
# Opt level: O2

bool __thiscall
sptk::ExcitationGeneration::Get
          (ExcitationGeneration *this,double *excitation,double *pulse,double *noise,double *pitch)

{
  RandomGenerationInterface *pRVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double noise_in_current_point;
  double local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  if (this->is_valid_ == true) {
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar3 = (*(this->input_source_->super_InputSourceInterface)._vptr_InputSourceInterface[4])();
    if (((char)iVar3 == '\0') || (*local_48._M_impl.super__Vector_impl_data._M_start < 0.0)) {
      bVar2 = false;
    }
    else {
      bVar2 = true;
      local_50 = *local_48._M_impl.super__Vector_impl_data._M_start;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    if (bVar2) {
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pRVar1 = this->random_generation_;
      if ((pRVar1 == (RandomGenerationInterface *)0x0) ||
         (iVar3 = (*pRVar1->_vptr_RandomGenerationInterface[3])(pRVar1,&local_48),
         (char)iVar3 != '\0')) {
        if (pitch != (double *)0x0) {
          *pitch = local_50;
        }
        if (noise != (double *)0x0) {
          *noise = (double)local_48._M_impl.super__Vector_impl_data._M_start;
        }
        dVar4 = this->input_source_->magic_number_;
        if ((dVar4 != local_50) || (NAN(dVar4) || NAN(local_50))) {
          dVar4 = 0.0;
          if (1.0 <= this->phase_) {
            this->phase_ = this->phase_ + -1.0;
            if (local_50 < 0.0) {
              dVar4 = sqrt(local_50);
            }
            else {
              dVar4 = SQRT(local_50);
            }
          }
          if (excitation != (double *)0x0) {
            *excitation = dVar4;
          }
          if (pulse != (double *)0x0) {
            *pulse = dVar4;
          }
          this->phase_ = 1.0 / local_50 + this->phase_;
          return true;
        }
        this->phase_ = 1.0;
        if (excitation != (double *)0x0) {
          *excitation = (double)local_48._M_impl.super__Vector_impl_data._M_start;
        }
        if (pulse == (double *)0x0) {
          return true;
        }
        *pulse = 0.0;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ExcitationGeneration::Get(double* excitation, double* pulse, double* noise,
                               double* pitch) {
  if (!is_valid_) {
    return false;
  }

  // Get pitch.
  double pitch_in_current_point;
  {
    std::vector<double> tmp;
    if (!input_source_->Get(&tmp) || tmp[0] < 0.0) {
      return false;
    }
    pitch_in_current_point = tmp[0];
  }

  // Get noise.
  double noise_in_current_point(0.0);
  if (random_generation_ && !random_generation_->Get(&noise_in_current_point)) {
    return false;
  }

  if (pitch) {
    *pitch = pitch_in_current_point;
  }
  if (noise) {
    *noise = noise_in_current_point;
  }

  // If unvoiced point, return white noise.
  if (input_source_->GetMagicNumber() == pitch_in_current_point) {
    phase_ = 1.0;
    if (excitation) {
      *excitation = noise_in_current_point;
    }
    if (pulse) {
      *pulse = 0.0;
    }
    return true;
  }

  // If voiced point, return pulse or zero.
  double pulse_in_current_point;
  if (1.0 <= phase_) {
    phase_ -= 1.0;
    pulse_in_current_point = std::sqrt(pitch_in_current_point);
  } else {
    pulse_in_current_point = 0.0;
  }

  if (excitation) {
    *excitation = pulse_in_current_point;
  }
  if (pulse) {
    *pulse = pulse_in_current_point;
  }

  // Proceed phase.
  phase_ += 1.0 / pitch_in_current_point;

  return true;
}